

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  vfloat<4> vVar10;
  ushort uVar11;
  ushort uVar12;
  BVH *bvh;
  size_t sVar13;
  Geometry *pGVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [12];
  byte bVar35;
  int iVar36;
  ulong uVar37;
  byte bVar38;
  byte bVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  float *pfVar43;
  NodeRef *pNVar44;
  size_t sVar45;
  ulong uVar46;
  uint uVar47;
  ulong uVar48;
  long lVar49;
  long lVar50;
  uint uVar51;
  NodeRef root;
  ulong uVar52;
  ushort uVar53;
  undefined4 uVar54;
  uint uVar55;
  ulong uVar56;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar57;
  bool bVar58;
  byte bVar59;
  ulong uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar95;
  float fVar96;
  vint4 bi_8;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar97;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  uint uVar98;
  uint uVar106;
  uint uVar107;
  vint4 ai_2;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  uint uVar108;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  float fVar109;
  vint4 bi;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 in_ZMM2 [64];
  vint4 bi_1;
  undefined1 auVar116 [16];
  vint4 bi_3;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  vint4 ai;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  vint4 bi_2;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  vint4 ai_1;
  undefined1 auVar130 [16];
  vint4 ai_13;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar133;
  vint4 ai_3;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar137;
  float fVar139;
  float fVar140;
  undefined1 auVar138 [16];
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  byte local_1b24;
  Precalculations pre;
  undefined1 local_1af8 [8];
  float fStack_1af0;
  float fStack_1aec;
  vfloat<4> upper_y;
  vfloat<4> lower_y;
  vfloat<4> upper_z;
  vfloat<4> lower_z;
  vfloat<4> upper_x;
  TravRayK<4,_false> tray;
  vfloat<4> lower_x;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar61 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar65 = ZEXT816(0) << 0x40;
    uVar23 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar65,5);
    uVar60 = vpcmpeqd_avx512vl(auVar61,(undefined1  [16])valid_i->field_0);
    uVar60 = ((byte)uVar23 & 0xf) & uVar60;
    bVar59 = (byte)uVar60;
    if (bVar59 != 0) {
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar149 = ZEXT1664(auVar61);
      auVar62 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar61);
      auVar64._8_4_ = 0x219392ef;
      auVar64._0_8_ = 0x219392ef219392ef;
      auVar64._12_4_ = 0x219392ef;
      uVar52 = vcmpps_avx512vl(auVar62,auVar64,1);
      bVar58 = (bool)((byte)uVar52 & 1);
      auVar62._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * tray.dir.field_0._0_4_;
      bVar58 = (bool)((byte)(uVar52 >> 1) & 1);
      auVar62._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * tray.dir.field_0._4_4_;
      bVar58 = (bool)((byte)(uVar52 >> 2) & 1);
      auVar62._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * tray.dir.field_0._8_4_;
      bVar58 = (bool)((byte)(uVar52 >> 3) & 1);
      auVar62._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * tray.dir.field_0._12_4_;
      auVar63 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar61);
      uVar52 = vcmpps_avx512vl(auVar63,auVar64,1);
      bVar58 = (bool)((byte)uVar52 & 1);
      auVar63._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * tray.dir.field_0._16_4_;
      bVar58 = (bool)((byte)(uVar52 >> 1) & 1);
      auVar63._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * tray.dir.field_0._20_4_;
      bVar58 = (bool)((byte)(uVar52 >> 2) & 1);
      auVar63._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * tray.dir.field_0._24_4_;
      bVar58 = (bool)((byte)(uVar52 >> 3) & 1);
      auVar63._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * tray.dir.field_0._28_4_;
      auVar61 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar61);
      uVar52 = vcmpps_avx512vl(auVar61,auVar64,1);
      bVar58 = (bool)((byte)uVar52 & 1);
      auVar82._0_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * tray.dir.field_0._32_4_;
      bVar58 = (bool)((byte)(uVar52 >> 1) & 1);
      auVar82._4_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * tray.dir.field_0._36_4_;
      bVar58 = (bool)((byte)(uVar52 >> 2) & 1);
      auVar82._8_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * tray.dir.field_0._40_4_;
      bVar58 = (bool)((byte)(uVar52 >> 3) & 1);
      auVar82._12_4_ = (uint)bVar58 * 0x219392ef | (uint)!bVar58 * tray.dir.field_0._44_4_;
      auVar64 = vrcp14ps_avx512vl(auVar62);
      auVar66._8_4_ = 0x3f800000;
      auVar66._0_8_ = 0x3f8000003f800000;
      auVar66._12_4_ = 0x3f800000;
      auVar61 = vfnmadd213ps_fma(auVar62,auVar64,auVar66);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar61,auVar64,auVar64)
      ;
      auVar62 = vrcp14ps_avx512vl(auVar63);
      auVar61 = vfnmadd213ps_fma(auVar63,auVar62,auVar66);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar61,auVar62,auVar62)
      ;
      auVar62 = vrcp14ps_avx512vl(auVar82);
      auVar61 = vfnmadd213ps_fma(auVar82,auVar62,auVar66);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar61,auVar62,auVar62)
      ;
      uVar52 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar65,1);
      auVar61 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar52 >> 1) & 1) * auVar61._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar52 & 1) * auVar61._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar52 >> 2) & 1) * auVar61._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar52 >> 3) & 1) * auVar61._12_4_;
      uVar52 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar65,5);
      auVar61 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar58 = (bool)((byte)uVar52 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar58 * auVar61._0_4_ | (uint)!bVar58 * 0x30;
      bVar58 = (bool)((byte)(uVar52 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar58 * auVar61._4_4_ | (uint)!bVar58 * 0x30;
      bVar58 = (bool)((byte)(uVar52 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar58 * auVar61._8_4_ | (uint)!bVar58 * 0x30;
      bVar58 = (bool)((byte)(uVar52 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar58 * auVar61._12_4_ | (uint)!bVar58 * 0x30;
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      uVar52 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar65,5);
      auVar61 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar58 = (bool)((byte)uVar52 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar58 * auVar61._0_4_ | (uint)!bVar58 * 0x50;
      bVar58 = (bool)((byte)(uVar52 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar58 * auVar61._4_4_ | (uint)!bVar58 * 0x50;
      bVar58 = (bool)((byte)(uVar52 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar58 * auVar61._8_4_ | (uint)!bVar58 * 0x50;
      bVar58 = (bool)((byte)(uVar52 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar58 * auVar61._12_4_ | (uint)!bVar58 * 0x50;
      tray.org_rdir.field_0._0_4_ = *(float *)ray * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = *(float *)(ray + 4) * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = *(float *)(ray + 8) * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = *(float *)(ray + 0xc) * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar151 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar61 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar65);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar59 & 1) * auVar61._0_4_ |
           (uint)!(bool)(bVar59 & 1) * stack_near[0].field_0._0_4_;
      bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar58 * auVar61._4_4_ | (uint)!bVar58 * stack_near[0].field_0._4_4_;
      bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar58 * auVar61._8_4_ | (uint)!bVar58 * stack_near[0].field_0._8_4_;
      bVar58 = SUB81(uVar60 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar58 * auVar61._12_4_ | (uint)!bVar58 * stack_near[0].field_0._12_4_;
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar150 = ZEXT1664(auVar61);
      auVar65 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar65);
      tray.tfar.field_0.i[0] =
           (uint)(bVar59 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar61._0_4_;
      bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar58 * auVar65._4_4_ | (uint)!bVar58 * auVar61._4_4_;
      bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar58 * auVar65._8_4_ | (uint)!bVar58 * auVar61._8_4_;
      bVar58 = SUB81(uVar60 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar58 * auVar65._12_4_ | (uint)!bVar58 * auVar61._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar47 = 3;
      }
      else {
        uVar47 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      uVar53 = (ushort)uVar60 ^ 0xf;
      pNVar44 = stack_node + 2;
      paVar57 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar152 = ZEXT1664(auVar61);
      auVar61 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
      auVar153 = ZEXT1664(auVar61);
LAB_006b1e26:
      do {
        local_1b24 = (byte)uVar53;
        auVar61 = auVar150._0_16_;
        do {
          root.ptr = pNVar44[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006b3048;
          pNVar44 = pNVar44 + -1;
          vVar10.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar57[-1].v;
          auVar105 = ZEXT1664((undefined1  [16])vVar10.field_0);
          paVar57 = paVar57 + -1;
          uVar60 = vcmpps_avx512vl((undefined1  [16])vVar10.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar60 == '\0');
        uVar54 = (undefined4)uVar60;
        if (uVar47 < (uint)POPCOUNT(uVar54)) {
LAB_006b1e6e:
          do {
            local_1b24 = (byte)uVar53;
            sVar45 = 8;
            auVar61 = auVar150._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006b3048;
              uVar23 = vcmpps_avx512vl(auVar105._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar23 != '\0') {
                uVar60 = (ulong)((uint)root.ptr & 0xf);
                bVar39 = (byte)(uVar53 & 0xff0f);
                if (uVar60 != 8) {
                  uVar52 = root.ptr & 0xfffffffffffffff0;
                  uVar53 = uVar53 & 0xff0f ^ 0xf;
                  lVar40 = 0;
                  do {
                    lVar49 = lVar40 * 0x58;
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = *(ulong *)(uVar52 + 0x20 + lVar49);
                    auVar74._8_8_ = 0;
                    auVar74._0_8_ = *(ulong *)(uVar52 + 0x24 + lVar49);
                    uVar46 = vpcmpub_avx512vl(auVar61,auVar74,2);
                    if ((uVar46 & 0xf) != 0) {
                      lVar49 = lVar49 + uVar52;
                      uVar46 = (ulong)((byte)uVar46 & 0xf);
                      do {
                        lVar25 = 0;
                        for (uVar37 = uVar46; (uVar37 & 1) == 0;
                            uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                          lVar25 = lVar25 + 1;
                        }
                        auVar81._8_8_ = 0;
                        auVar81._0_8_ = *(ulong *)(lVar49 + 0x20);
                        auVar61 = vpmovzxbd_avx(auVar81);
                        auVar61 = vcvtdq2ps_avx(auVar61);
                        uVar54 = *(undefined4 *)(lVar49 + 0x44);
                        auVar99._4_4_ = uVar54;
                        auVar99._0_4_ = uVar54;
                        auVar99._8_4_ = uVar54;
                        auVar99._12_4_ = uVar54;
                        uVar54 = *(undefined4 *)(lVar49 + 0x38);
                        auVar110._4_4_ = uVar54;
                        auVar110._0_4_ = uVar54;
                        auVar110._8_4_ = uVar54;
                        auVar110._12_4_ = uVar54;
                        lower_x.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vfmadd213ps_fma(auVar61,auVar99,auVar110);
                        auVar86._8_8_ = 0;
                        auVar86._0_8_ = *(ulong *)(lVar49 + 0x24);
                        auVar61 = vpmovzxbd_avx(auVar86);
                        auVar61 = vcvtdq2ps_avx(auVar61);
                        upper_x.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vfmadd213ps_fma(auVar61,auVar99,auVar110);
                        auVar83._8_8_ = 0;
                        auVar83._0_8_ = *(ulong *)(lVar49 + 0x28);
                        auVar61 = vpmovzxbd_avx(auVar83);
                        auVar61 = vcvtdq2ps_avx(auVar61);
                        uVar54 = *(undefined4 *)(lVar49 + 0x48);
                        auVar100._4_4_ = uVar54;
                        auVar100._0_4_ = uVar54;
                        auVar100._8_4_ = uVar54;
                        auVar100._12_4_ = uVar54;
                        uVar54 = *(undefined4 *)(lVar49 + 0x3c);
                        auVar111._4_4_ = uVar54;
                        auVar111._0_4_ = uVar54;
                        auVar111._8_4_ = uVar54;
                        auVar111._12_4_ = uVar54;
                        lower_y.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vfmadd213ps_fma(auVar61,auVar100,auVar111);
                        auVar87._8_8_ = 0;
                        auVar87._0_8_ = *(ulong *)(lVar49 + 0x2c);
                        auVar61 = vpmovzxbd_avx(auVar87);
                        auVar61 = vcvtdq2ps_avx(auVar61);
                        upper_y.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vfmadd213ps_fma(auVar61,auVar100,auVar111);
                        auVar88._8_8_ = 0;
                        auVar88._0_8_ = *(ulong *)(lVar49 + 0x30);
                        auVar61 = vpmovzxbd_avx(auVar88);
                        auVar61 = vcvtdq2ps_avx(auVar61);
                        uVar54 = *(undefined4 *)(lVar49 + 0x4c);
                        auVar101._4_4_ = uVar54;
                        auVar101._0_4_ = uVar54;
                        auVar101._8_4_ = uVar54;
                        auVar101._12_4_ = uVar54;
                        uVar54 = *(undefined4 *)(lVar49 + 0x40);
                        auVar112._4_4_ = uVar54;
                        auVar112._0_4_ = uVar54;
                        auVar112._8_4_ = uVar54;
                        auVar112._12_4_ = uVar54;
                        lower_z.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vfmadd213ps_fma(auVar61,auVar101,auVar112);
                        auVar89._8_8_ = 0;
                        auVar89._0_8_ = *(ulong *)(lVar49 + 0x34);
                        auVar61 = vpmovzxbd_avx(auVar89);
                        auVar61 = vcvtdq2ps_avx(auVar61);
                        upper_z.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vfmadd213ps_fma(auVar61,auVar101,auVar112);
                        auVar79._4_4_ = tray.org_rdir.field_0._4_4_;
                        auVar79._0_4_ = tray.org_rdir.field_0._0_4_;
                        auVar79._8_4_ = tray.org_rdir.field_0._8_4_;
                        auVar79._12_4_ = tray.org_rdir.field_0._12_4_;
                        uVar37 = (ulong)(uint)((int)lVar25 * 4);
                        uVar54 = *(undefined4 *)((long)&lower_x.field_0 + uVar37);
                        auVar117._4_4_ = uVar54;
                        auVar117._0_4_ = uVar54;
                        auVar117._8_4_ = uVar54;
                        auVar117._12_4_ = uVar54;
                        auVar62 = vfmsub132ps_fma(auVar117,auVar79,
                                                  (undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0);
                        uVar54 = *(undefined4 *)((long)&lower_y.field_0 + uVar37);
                        auVar128._4_4_ = uVar54;
                        auVar128._0_4_ = uVar54;
                        auVar128._8_4_ = uVar54;
                        auVar128._12_4_ = uVar54;
                        auVar80._4_4_ = tray.org_rdir.field_0._36_4_;
                        auVar80._0_4_ = tray.org_rdir.field_0._32_4_;
                        auVar80._8_4_ = tray.org_rdir.field_0._40_4_;
                        auVar80._12_4_ = tray.org_rdir.field_0._44_4_;
                        uVar54 = *(undefined4 *)((long)&lower_z.field_0 + uVar37);
                        auVar131._4_4_ = uVar54;
                        auVar131._0_4_ = uVar54;
                        auVar131._8_4_ = uVar54;
                        auVar131._12_4_ = uVar54;
                        auVar63 = vfmsub132ps_fma(auVar128,(undefined1  [16])
                                                           tray.org_rdir.field_0.field_0.y.field_0,
                                                  (undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0);
                        auVar82 = vfmsub132ps_fma(auVar131,auVar80,
                                                  (undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0);
                        uVar54 = *(undefined4 *)((long)&upper_x.field_0 + uVar37);
                        auVar76._4_4_ = uVar54;
                        auVar76._0_4_ = uVar54;
                        auVar76._8_4_ = uVar54;
                        auVar76._12_4_ = uVar54;
                        auVar64 = vfmsub132ps_avx512vl
                                            ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,
                                             auVar79,auVar76);
                        uVar54 = *(undefined4 *)((long)&upper_y.field_0 + uVar37);
                        auVar77._4_4_ = uVar54;
                        auVar77._0_4_ = uVar54;
                        auVar77._8_4_ = uVar54;
                        auVar77._12_4_ = uVar54;
                        auVar66 = vfmsub132ps_avx512vl
                                            ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                             (undefined1  [16])
                                             tray.org_rdir.field_0.field_0.y.field_0,auVar77);
                        uVar54 = *(undefined4 *)((long)&upper_z.field_0 + uVar37);
                        auVar78._4_4_ = uVar54;
                        auVar78._0_4_ = uVar54;
                        auVar78._8_4_ = uVar54;
                        auVar78._12_4_ = uVar54;
                        auVar67 = vfmsub132ps_avx512vl
                                            ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,
                                             auVar80,auVar78);
                        auVar61 = vpminsd_avx(auVar62,auVar64);
                        auVar65 = vpminsd_avx(auVar63,auVar66);
                        auVar61 = vpmaxsd_avx(auVar61,auVar65);
                        auVar65 = vpminsd_avx(auVar82,auVar67);
                        auVar61 = vpmaxsd_avx(auVar61,auVar65);
                        auVar65 = vpmaxsd_avx(auVar62,auVar64);
                        auVar62 = vpmaxsd_avx(auVar63,auVar66);
                        auVar62 = vpminsd_avx(auVar65,auVar62);
                        auVar65 = vpmaxsd_avx(auVar82,auVar67);
                        auVar65 = vpminsd_avx(auVar62,auVar65);
                        auVar61 = vpmaxsd_avx(auVar61,(undefined1  [16])tray.tnear.field_0);
                        auVar65 = vpminsd_avx(auVar65,(undefined1  [16])tray.tfar.field_0);
                        uVar23 = vpcmpd_avx512vl(auVar61,auVar65,2);
                        bVar39 = (byte)uVar53;
                        if ((bVar39 & (byte)uVar23 & 0xf) == 0) {
                          bVar58 = false;
                        }
                        else {
                          uVar11 = *(ushort *)(lVar49 + lVar25 * 8);
                          uVar12 = *(ushort *)(lVar49 + 2 + lVar25 * 8);
                          pGVar14 = (context->scene->geometries).items[*(uint *)(lVar49 + 0x50)].ptr
                          ;
                          lVar15 = *(long *)&pGVar14->field_0x58;
                          lVar16 = *(long *)&pGVar14[1].time_range.upper;
                          lVar41 = (ulong)*(uint *)(lVar49 + 4 + lVar25 * 8) *
                                   pGVar14[1].super_RefCount.refCounter.
                                   super___atomic_base<unsigned_long>._M_i;
                          uVar55 = uVar11 & 0x7fff;
                          uVar51 = uVar12 & 0x7fff;
                          uVar98 = *(uint *)(lVar15 + 4 + lVar41);
                          uVar48 = (ulong)uVar98;
                          uVar56 = (ulong)(uVar98 * uVar51 + *(int *)(lVar15 + lVar41) + uVar55);
                          p_Var17 = pGVar14[1].intersectionFilterN;
                          puVar2 = (undefined8 *)(lVar16 + (uVar56 + 1) * (long)p_Var17);
                          lVar25 = uVar56 + uVar48;
                          lVar50 = uVar56 + uVar48 + 1;
                          puVar3 = (undefined8 *)(lVar16 + lVar25 * (long)p_Var17);
                          uStack_17a0 = puVar3[1];
                          puVar4 = (undefined8 *)(lVar16 + lVar50 * (long)p_Var17);
                          local_1768 = *puVar4;
                          uStack_1760 = puVar4[1];
                          uVar37 = (ulong)(-1 < (short)uVar11);
                          puVar4 = (undefined8 *)(lVar16 + (uVar56 + uVar37 + 1) * (long)p_Var17);
                          lVar42 = uVar37 + lVar50;
                          puVar5 = (undefined8 *)(lVar16 + lVar42 * (long)p_Var17);
                          local_1778 = *puVar5;
                          uStack_1770 = puVar5[1];
                          if ((short)uVar12 < 0) {
                            uVar48 = 0;
                          }
                          puVar5 = (undefined8 *)(lVar16 + (lVar25 + uVar48) * (long)p_Var17);
                          puVar6 = (undefined8 *)(lVar16 + (lVar50 + uVar48) * (long)p_Var17);
                          local_1738 = *puVar6;
                          uStack_1730 = puVar6[1];
                          puVar6 = (undefined8 *)(lVar16 + (uVar48 + lVar42) * (long)p_Var17);
                          auVar61 = vpbroadcastd_avx512vl();
                          auVar105 = ZEXT1664(auVar61);
                          lower_x.field_0 =
                               *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                                (lVar16 + (long)p_Var17 * uVar56);
                          local_1798 = *puVar2;
                          uStack_1790 = puVar2[1];
                          local_1788 = *puVar4;
                          uStack_1780 = puVar4[1];
                          local_1758 = *puVar3;
                          uStack_1750 = uStack_17a0;
                          local_1748 = local_1768;
                          uStack_1740 = uStack_1760;
                          local_1728 = *puVar5;
                          uStack_1720 = puVar5[1];
                          local_1718 = local_1768;
                          uStack_1710 = uStack_1760;
                          local_1708 = local_1778;
                          uStack_1700 = uStack_1770;
                          local_16f8 = *puVar6;
                          uStack_16f0 = puVar6[1];
                          local_16e8 = local_1738;
                          uStack_16e0 = uStack_1730;
                          auVar61 = vpbroadcastd_avx512vl();
                          auVar154 = ZEXT1664(auVar61);
                          pfVar43 = (float *)&uStack_17a0;
                          uVar37 = 0;
                          do {
                            fVar7 = pfVar43[-0xe];
                            auVar102._4_4_ = fVar7;
                            auVar102._0_4_ = fVar7;
                            auVar102._8_4_ = fVar7;
                            auVar102._12_4_ = fVar7;
                            fVar85 = pfVar43[-0xd];
                            auVar122._4_4_ = fVar85;
                            auVar122._0_4_ = fVar85;
                            auVar122._8_4_ = fVar85;
                            auVar122._12_4_ = fVar85;
                            fVar95 = pfVar43[-0xc];
                            auVar134._4_4_ = fVar95;
                            auVar134._0_4_ = fVar95;
                            auVar134._8_4_ = fVar95;
                            auVar134._12_4_ = fVar95;
                            fVar96 = pfVar43[-10];
                            fVar97 = pfVar43[-9];
                            fVar8 = pfVar43[-8];
                            auVar69 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar43[-6]));
                            auVar70 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar43[-5]));
                            auVar71 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar43[-4]));
                            fVar133 = pfVar43[-2];
                            local_1af8._4_4_ = pfVar43[-1];
                            fVar9 = *pfVar43;
                            lower_z.field_0 =
                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vmovdqa64_avx512vl(auVar154._0_16_);
                            upper_z.field_0 =
                                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vmovdqa64_avx512vl(auVar105._0_16_);
                            fVar139 = fVar7 - fVar96;
                            auVar138._4_4_ = fVar139;
                            auVar138._0_4_ = fVar139;
                            auVar138._8_4_ = fVar139;
                            auVar138._12_4_ = fVar139;
                            fVar22 = fVar85 - fVar97;
                            auVar142._4_4_ = fVar22;
                            auVar142._0_4_ = fVar22;
                            auVar142._8_4_ = fVar22;
                            auVar142._12_4_ = fVar22;
                            fVar137 = fVar95 - fVar8;
                            auVar145._4_4_ = fVar137;
                            auVar145._0_4_ = fVar137;
                            auVar145._8_4_ = fVar137;
                            auVar145._12_4_ = fVar137;
                            auVar72 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar133 - fVar7)));
                            local_1af8._0_4_ = local_1af8._4_4_;
                            fStack_1af0 = (float)local_1af8._4_4_;
                            fStack_1aec = (float)local_1af8._4_4_;
                            auVar73 = vbroadcastss_avx512vl
                                                (ZEXT416((uint)((float)local_1af8._4_4_ - fVar85)));
                            auVar74 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar9 - fVar95)));
                            fVar22 = fVar22 * (fVar9 - fVar95);
                            auVar129._4_4_ = fVar22;
                            auVar129._0_4_ = fVar22;
                            auVar129._8_4_ = fVar22;
                            auVar129._12_4_ = fVar22;
                            aVar75 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                     vfmsub231ps_avx512vl(auVar129,auVar73,auVar145);
                            fVar137 = fVar137 * (fVar133 - fVar7);
                            auVar130._4_4_ = fVar137;
                            auVar130._0_4_ = fVar137;
                            auVar130._8_4_ = fVar137;
                            auVar130._12_4_ = fVar137;
                            auVar76 = vfmsub231ps_avx512vl(auVar130,auVar74,auVar138);
                            fVar139 = ((float)local_1af8._4_4_ - fVar85) * fVar139;
                            auVar132._4_4_ = fVar139;
                            auVar132._0_4_ = fVar139;
                            auVar132._8_4_ = fVar139;
                            auVar132._12_4_ = fVar139;
                            auVar61 = *(undefined1 (*) [16])ray;
                            auVar65 = *(undefined1 (*) [16])(ray + 0x10);
                            auVar62 = *(undefined1 (*) [16])(ray + 0x20);
                            auVar63 = *(undefined1 (*) [16])(ray + 0x40);
                            auVar77 = vfmsub231ps_avx512vl(auVar132,auVar72,auVar142);
                            auVar66 = vsubps_avx(auVar102,auVar61);
                            auVar67 = vsubps_avx(auVar122,auVar65);
                            auVar68 = vsubps_avx(auVar134,auVar62);
                            auVar82 = *(undefined1 (*) [16])(ray + 0x50);
                            auVar64 = *(undefined1 (*) [16])(ray + 0x60);
                            auVar78 = vmulps_avx512vl(auVar82,auVar68);
                            auVar78 = vfmsub231ps_avx512vl(auVar78,auVar67,auVar64);
                            auVar79 = vmulps_avx512vl(auVar64,auVar66);
                            auVar79 = vfmsub231ps_avx512vl(auVar79,auVar68,auVar63);
                            auVar80 = vmulps_avx512vl(auVar63,auVar67);
                            auVar80 = vfmsub231ps_avx512vl(auVar80,auVar66,auVar82);
                            auVar81 = vmulps_avx512vl(auVar74,auVar80);
                            auVar73 = vfmadd231ps_avx512vl(auVar81,auVar79,auVar73);
                            auVar81 = vmulps_avx512vl(auVar77,auVar64);
                            auVar81 = vfmadd231ps_avx512vl(auVar81,auVar76,auVar82);
                            auVar81 = vfmadd231ps_avx512vl(auVar81,(undefined1  [16])aVar75,auVar63)
                            ;
                            auVar72 = vfmadd231ps_avx512vl(auVar73,auVar78,auVar72);
                            auVar73 = vandps_avx512vl(auVar81,auVar152._0_16_);
                            auVar72 = vxorps_avx512vl(auVar73,auVar72);
                            auVar86 = auVar153._0_16_;
                            uVar23 = vcmpps_avx512vl(auVar72,auVar86,5);
                            bVar38 = (byte)uVar23 & (byte)uVar53;
                            if (bVar38 != 0) {
                              auVar80 = vmulps_avx512vl(auVar145,auVar80);
                              auVar79 = vfmadd213ps_avx512vl(auVar79,auVar142,auVar80);
                              auVar78 = vfmadd213ps_avx512vl(auVar78,auVar138,auVar79);
                              auVar79 = vxorps_avx512vl(auVar73,auVar78);
                              uVar23 = vcmpps_avx512vl(auVar79,auVar86,5);
                              bVar38 = bVar38 & (byte)uVar23;
                              if (bVar38 != 0) {
                                auVar87 = auVar149._0_16_;
                                auVar83 = vandps_avx512vl(auVar81,auVar87);
                                auVar80 = vsubps_avx(auVar83,auVar72);
                                uVar23 = vcmpps_avx512vl(auVar80,auVar79,5);
                                bVar38 = bVar38 & (byte)uVar23;
                                if (bVar38 != 0) {
                                  auVar80 = vmovdqa64_avx512vl(auVar154._0_16_);
                                  auVar88 = vmovdqa64_avx512vl(auVar105._0_16_);
                                  auVar78 = vxorps_avx512vl(auVar78,auVar78);
                                  auVar146._0_4_ = auVar77._0_4_ * auVar68._0_4_;
                                  auVar146._4_4_ = auVar77._4_4_ * auVar68._4_4_;
                                  auVar146._8_4_ = auVar77._8_4_ * auVar68._8_4_;
                                  auVar146._12_4_ = auVar77._12_4_ * auVar68._12_4_;
                                  auVar67 = vfmadd213ps_fma(auVar67,auVar76,auVar146);
                                  auVar66 = vfmadd213ps_fma(auVar66,(undefined1  [16])aVar75,auVar67
                                                           );
                                  auVar66 = vxorps_avx512vl(auVar73,auVar66);
                                  fVar137 = auVar83._0_4_;
                                  auVar143._0_4_ = fVar137 * *(float *)(ray + 0x30);
                                  fVar139 = auVar83._4_4_;
                                  auVar143._4_4_ = fVar139 * *(float *)(ray + 0x34);
                                  fVar140 = auVar83._8_4_;
                                  auVar143._8_4_ = fVar140 * *(float *)(ray + 0x38);
                                  fVar141 = auVar83._12_4_;
                                  auVar143._12_4_ = fVar141 * *(float *)(ray + 0x3c);
                                  fVar7 = *(float *)(ray + 0x80);
                                  fVar85 = *(float *)(ray + 0x84);
                                  fVar95 = *(float *)(ray + 0x88);
                                  fVar22 = *(float *)(ray + 0x8c);
                                  auVar147._0_4_ = fVar137 * fVar7;
                                  auVar147._4_4_ = fVar139 * fVar85;
                                  auVar147._8_4_ = fVar140 * fVar95;
                                  auVar147._12_4_ = fVar141 * fVar22;
                                  uVar23 = vcmpps_avx512vl(auVar66,auVar147,2);
                                  uVar24 = vcmpps_avx512vl(auVar143,auVar66,1);
                                  bVar38 = bVar38 & (byte)uVar23 & (byte)uVar24;
                                  if (bVar38 != 0) {
                                    uVar23 = vcmpps_avx512vl(auVar81,auVar78,4);
                                    bVar38 = bVar38 & (byte)uVar23;
                                    if (bVar38 != 0) {
                                      pGVar14 = (context->scene->geometries).items
                                                [(uint)lower_z.field_0.i[uVar37]].ptr;
                                      uVar98 = pGVar14->mask;
                                      auVar144._4_4_ = uVar98;
                                      auVar144._0_4_ = uVar98;
                                      auVar144._8_4_ = uVar98;
                                      auVar144._12_4_ = uVar98;
                                      uVar23 = vptestmd_avx512vl(auVar144,*(undefined1 (*) [16])
                                                                           (ray + 0x90));
                                      bVar35 = (byte)uVar23 & 0xf & bVar38;
                                      if (bVar35 != 0) {
                                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                           (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                          auVar61 = vcvtsi2ss_avx512f(auVar87,*(ushort *)
                                                                               (lVar15 + 8 + lVar41)
                                                                              - 1);
                                          auVar65 = vcvtsi2ss_avx512f(auVar87,*(ushort *)
                                                                               (lVar15 + 10 + lVar41
                                                                               ) - 1);
                                          auVar62 = vcvtsi2ss_avx512f(auVar87,((uint)uVar37 & 1) +
                                                                              uVar55);
                                          auVar63 = vcvtsi2ss_avx512f(auVar87,((uint)(uVar37 >> 1) &
                                                                              0x7fffffff) + uVar51);
                                          vpbroadcastd_avx512vl();
                                          auVar126._4_12_ = SUB1612((undefined1  [16])0x0,4);
                                          auVar126._0_4_ = auVar61._0_4_;
                                          auVar82 = vrcp14ss_avx512f((undefined1  [16])0x0,auVar126)
                                          ;
                                          auVar61 = vfnmadd213ss_fma(auVar61,auVar82,
                                                                     SUB6416(ZEXT464(0x40000000),0))
                                          ;
                                          fVar21 = auVar82._0_4_ * auVar61._0_4_;
                                          fVar109 = auVar62._0_4_;
                                          auVar115._0_4_ = auVar72._0_4_ + fVar137 * fVar109;
                                          auVar115._4_4_ = auVar72._4_4_ + fVar139 * fVar109;
                                          auVar115._8_4_ = auVar72._8_4_ + fVar140 * fVar109;
                                          auVar115._12_4_ = auVar72._12_4_ + fVar141 * fVar109;
                                          auVar91._4_4_ = fVar21;
                                          auVar91._0_4_ = fVar21;
                                          auVar91._8_4_ = fVar21;
                                          auVar91._12_4_ = fVar21;
                                          auVar62 = vmulps_avx512vl(auVar115,auVar91);
                                          bVar58 = (bool)(bVar38 >> 1 & 1);
                                          bVar18 = (bool)(bVar38 >> 2 & 1);
                                          auVar92._4_12_ = SUB1612((undefined1  [16])0x0,4);
                                          auVar92._0_4_ = auVar65._0_4_;
                                          auVar82 = vrcp14ss_avx512f((undefined1  [16])0x0,auVar92);
                                          auVar61 = vfnmadd213ss_fma(auVar65,auVar82,
                                                                     SUB6416(ZEXT464(0x40000000),0))
                                          ;
                                          fVar21 = auVar82._0_4_ * auVar61._0_4_;
                                          fVar109 = auVar63._0_4_;
                                          auVar104._0_4_ = auVar79._0_4_ + fVar137 * fVar109;
                                          auVar104._4_4_ = auVar79._4_4_ + fVar139 * fVar109;
                                          auVar104._8_4_ = auVar79._8_4_ + fVar140 * fVar109;
                                          auVar104._12_4_ = auVar79._12_4_ + fVar141 * fVar109;
                                          auVar93._4_4_ = fVar21;
                                          auVar93._0_4_ = fVar21;
                                          auVar93._8_4_ = fVar21;
                                          auVar93._12_4_ = fVar21;
                                          vmulps_avx512vl(auVar104,auVar93);
                                          auVar61 = vrcp14ps_avx512vl(auVar83);
                                          auVar27._8_4_ = 0x3f800000;
                                          auVar27._0_8_ = 0x3f8000003f800000;
                                          auVar27._12_4_ = 0x3f800000;
                                          auVar65 = vfnmadd213ps_avx512vl(auVar83,auVar61,auVar27);
                                          auVar61 = vfmadd132ps_fma(auVar65,auVar61,auVar61);
                                          vpbroadcastd_avx512vl();
                                          upper_x.field_0 = aVar75;
                                          auVar94 = ZEXT1632(CONCAT412((float)((uint)(bVar38 >> 3) *
                                                                               auVar62._12_4_ |
                                                                              (uint)!(bool)(bVar38 
                                                  >> 3) * (int)auVar72._12_4_) * auVar61._12_4_,
                                                  CONCAT48((float)((uint)bVar18 * auVar62._8_4_ |
                                                                  (uint)!bVar18 * (int)auVar72._8_4_
                                                                  ) * auVar61._8_4_,
                                                           CONCAT44((float)((uint)bVar58 *
                                                                            auVar62._4_4_ |
                                                                           (uint)!bVar58 *
                                                                           (int)auVar72._4_4_) *
                                                                    auVar61._4_4_,
                                                                    (float)((uint)(bVar38 & 1) *
                                                                            auVar62._0_4_ |
                                                                           (uint)!(bool)(bVar38 & 1)
                                                                           * (int)auVar72._0_4_) *
                                                                    auVar61._0_4_))));
                                          vpcmpeqd_avx2(auVar94,auVar94);
                                          auVar61 = vmulps_avx512vl(auVar61,auVar66);
                                          bVar58 = (bool)(bVar35 >> 1 & 1);
                                          bVar18 = (bool)(bVar35 >> 2 & 1);
                                          *(uint *)(ray + 0x80) =
                                               (uint)(bVar35 & 1) * auVar61._0_4_ |
                                               (uint)!(bool)(bVar35 & 1) * (int)fVar7;
                                          *(uint *)(ray + 0x84) =
                                               (uint)bVar58 * auVar61._4_4_ |
                                               (uint)!bVar58 * (int)fVar85;
                                          *(uint *)(ray + 0x88) =
                                               (uint)bVar18 * auVar61._8_4_ |
                                               (uint)!bVar18 * (int)fVar95;
                                          *(uint *)(ray + 0x8c) =
                                               (uint)(bVar35 >> 3) * auVar61._12_4_ |
                                               (uint)!(bool)(bVar35 >> 3) * (int)fVar22;
                                          upper_y.field_0 =
                                               (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                               vpmovm2d_avx512vl((ulong)bVar35);
                                          lower_y.field_0._8_8_ = pGVar14->userPtr;
                                          lower_y.field_0._0_8_ = &upper_y;
                                          if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                          {
                                            (*pGVar14->occlusionFilterN)
                                                      ((RTCFilterFunctionNArguments *)&lower_y);
                                          }
                                          uVar48 = vptestmd_avx512vl((undefined1  [16])
                                                                     upper_y.field_0,
                                                                     (undefined1  [16])
                                                                     upper_y.field_0);
                                          if ((uVar48 & 0xf) == 0) {
                                            uVar48 = 0;
                                          }
                                          else {
                                            p_Var17 = context->args->filter;
                                            if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                                               (((context->args->flags &
                                                 RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                                              (*p_Var17)((RTCFilterFunctionNArguments *)&lower_y);
                                            }
                                            uVar48 = vptestmd_avx512vl((undefined1  [16])
                                                                       upper_y.field_0,
                                                                       (undefined1  [16])
                                                                       upper_y.field_0);
                                            uVar48 = uVar48 & 0xf;
                                            auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                            bVar58 = (bool)((byte)uVar48 & 1);
                                            bVar18 = (bool)((byte)(uVar48 >> 1) & 1);
                                            bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
                                            bVar20 = SUB81(uVar48 >> 3,0);
                                            *(uint *)(ray + 0x80) =
                                                 (uint)bVar58 * auVar61._0_4_ |
                                                 (uint)!bVar58 * *(int *)(ray + 0x80);
                                            *(uint *)(ray + 0x84) =
                                                 (uint)bVar18 * auVar61._4_4_ |
                                                 (uint)!bVar18 * *(int *)(ray + 0x84);
                                            *(uint *)(ray + 0x88) =
                                                 (uint)bVar19 * auVar61._8_4_ |
                                                 (uint)!bVar19 * *(int *)(ray + 0x88);
                                            *(uint *)(ray + 0x8c) =
                                                 (uint)bVar20 * auVar61._12_4_ |
                                                 (uint)!bVar20 * *(int *)(ray + 0x8c);
                                          }
                                          bVar35 = (byte)uVar48;
                                          bVar58 = (bool)((byte)(uVar48 >> 1) & 1);
                                          bVar18 = (bool)((byte)(uVar48 >> 2) & 1);
                                          bVar19 = SUB81(uVar48 >> 3,0);
                                          *(uint *)(ray + 0x80) =
                                               (uint)(bVar35 & 1) * *(int *)(ray + 0x80) |
                                               (uint)!(bool)(bVar35 & 1) * (int)fVar7;
                                          *(uint *)(ray + 0x84) =
                                               (uint)bVar58 * *(int *)(ray + 0x84) |
                                               (uint)!bVar58 * (int)fVar85;
                                          *(uint *)(ray + 0x88) =
                                               (uint)bVar18 * *(int *)(ray + 0x88) |
                                               (uint)!bVar18 * (int)fVar95;
                                          *(uint *)(ray + 0x8c) =
                                               (uint)bVar19 * *(int *)(ray + 0x8c) |
                                               (uint)!bVar19 * (int)fVar22;
                                          auVar61 = *(undefined1 (*) [16])ray;
                                          auVar65 = *(undefined1 (*) [16])(ray + 0x10);
                                          auVar62 = *(undefined1 (*) [16])(ray + 0x20);
                                          auVar63 = *(undefined1 (*) [16])(ray + 0x40);
                                          auVar82 = *(undefined1 (*) [16])(ray + 0x50);
                                          auVar64 = *(undefined1 (*) [16])(ray + 0x60);
                                        }
                                        uVar53 = (ushort)(byte)((bVar35 ^ 0xf) & (byte)uVar53);
                                      }
                                    }
                                  }
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar149 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  auVar150 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar151 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar152 = ZEXT1664(auVar66);
                                  auVar66 = vxorps_avx512vl(auVar86,auVar86);
                                  auVar153 = ZEXT1664(auVar66);
                                  auVar66 = vmovdqa64_avx512vl(auVar88);
                                  auVar105 = ZEXT1664(auVar66);
                                  auVar66 = vmovdqa64_avx512vl(auVar80);
                                  auVar154 = ZEXT1664(auVar66);
                                }
                              }
                            }
                            auVar29._4_4_ = fVar133;
                            auVar29._0_4_ = fVar133;
                            auVar29._8_4_ = fVar133;
                            auVar29._12_4_ = fVar133;
                            auVar30._4_4_ = fVar9;
                            auVar30._0_4_ = fVar9;
                            auVar30._8_4_ = fVar9;
                            auVar30._12_4_ = fVar9;
                            auVar67 = vsubps_avx512vl(auVar69,auVar29);
                            auVar68 = vsubps_avx512vl(auVar70,_local_1af8);
                            auVar72 = vsubps_avx512vl(auVar71,auVar30);
                            auVar33._4_4_ = fVar96;
                            auVar33._0_4_ = fVar96;
                            auVar33._8_4_ = fVar96;
                            auVar33._12_4_ = fVar96;
                            auVar73 = vsubps_avx512vl(auVar33,auVar69);
                            auVar32._4_4_ = fVar97;
                            auVar32._0_4_ = fVar97;
                            auVar32._8_4_ = fVar97;
                            auVar32._12_4_ = fVar97;
                            auVar76 = vsubps_avx512vl(auVar32,auVar70);
                            auVar31._4_4_ = fVar8;
                            auVar31._0_4_ = fVar8;
                            auVar31._8_4_ = fVar8;
                            auVar31._12_4_ = fVar8;
                            auVar77 = vsubps_avx512vl(auVar31,auVar71);
                            auVar66 = vmulps_avx512vl(auVar68,auVar77);
                            aVar75 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                     vfmsub231ps_avx512vl(auVar66,auVar76,auVar72);
                            auVar66 = vmulps_avx512vl(auVar72,auVar73);
                            auVar78 = vfmsub231ps_avx512vl(auVar66,auVar77,auVar67);
                            auVar66 = vmulps_avx512vl(auVar67,auVar76);
                            auVar79 = vfmsub231ps_avx512vl(auVar66,auVar73,auVar68);
                            auVar69 = vsubps_avx512vl(auVar69,auVar61);
                            auVar70 = vsubps_avx512vl(auVar70,auVar65);
                            auVar71 = vsubps_avx512vl(auVar71,auVar62);
                            auVar113._0_4_ = auVar71._0_4_ * auVar82._0_4_;
                            auVar113._4_4_ = auVar71._4_4_ * auVar82._4_4_;
                            auVar113._8_4_ = auVar71._8_4_ * auVar82._8_4_;
                            auVar113._12_4_ = auVar71._12_4_ * auVar82._12_4_;
                            auVar65 = vfmsub231ps_fma(auVar113,auVar70,auVar64);
                            auVar116._0_4_ = auVar69._0_4_ * auVar64._0_4_;
                            auVar116._4_4_ = auVar69._4_4_ * auVar64._4_4_;
                            auVar116._8_4_ = auVar69._8_4_ * auVar64._8_4_;
                            auVar116._12_4_ = auVar69._12_4_ * auVar64._12_4_;
                            auVar62 = vfmsub231ps_fma(auVar116,auVar71,auVar63);
                            auVar148._0_4_ = auVar70._0_4_ * auVar63._0_4_;
                            auVar148._4_4_ = auVar70._4_4_ * auVar63._4_4_;
                            auVar148._8_4_ = auVar70._8_4_ * auVar63._8_4_;
                            auVar148._12_4_ = auVar70._12_4_ * auVar63._12_4_;
                            auVar66 = vfmsub231ps_fma(auVar148,auVar69,auVar82);
                            auVar118._0_4_ = auVar79._0_4_ * auVar64._0_4_;
                            auVar118._4_4_ = auVar79._4_4_ * auVar64._4_4_;
                            auVar118._8_4_ = auVar79._8_4_ * auVar64._8_4_;
                            auVar118._12_4_ = auVar79._12_4_ * auVar64._12_4_;
                            auVar61 = vfmadd231ps_fma(auVar118,auVar78,auVar82);
                            auVar61 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar75,auVar63);
                            auVar63 = vandps_avx512vl(auVar61,auVar152._0_16_);
                            auVar82 = vmulps_avx512vl(auVar77,auVar66);
                            auVar82 = vfmadd231ps_avx512vl(auVar82,auVar62,auVar76);
                            auVar82 = vfmadd231ps_avx512vl(auVar82,auVar65,auVar73);
                            uVar98 = auVar63._0_4_;
                            auVar123._0_4_ = uVar98 ^ auVar82._0_4_;
                            uVar106 = auVar63._4_4_;
                            auVar123._4_4_ = uVar106 ^ auVar82._4_4_;
                            uVar107 = auVar63._8_4_;
                            auVar123._8_4_ = uVar107 ^ auVar82._8_4_;
                            uVar108 = auVar63._12_4_;
                            auVar123._12_4_ = uVar108 ^ auVar82._12_4_;
                            auVar63 = auVar153._0_16_;
                            uVar23 = vcmpps_avx512vl(auVar123,auVar63,5);
                            bVar38 = (byte)uVar23 & (byte)uVar53;
                            if (bVar38 != 0) {
                              auVar90._0_4_ = auVar72._0_4_ * auVar66._0_4_;
                              auVar90._4_4_ = auVar72._4_4_ * auVar66._4_4_;
                              auVar90._8_4_ = auVar72._8_4_ * auVar66._8_4_;
                              auVar90._12_4_ = auVar72._12_4_ * auVar66._12_4_;
                              auVar62 = vfmadd213ps_fma(auVar62,auVar68,auVar90);
                              auVar65 = vfmadd213ps_fma(auVar65,auVar67,auVar62);
                              auVar114._0_4_ = uVar98 ^ auVar65._0_4_;
                              auVar114._4_4_ = uVar106 ^ auVar65._4_4_;
                              auVar114._8_4_ = uVar107 ^ auVar65._8_4_;
                              auVar114._12_4_ = uVar108 ^ auVar65._12_4_;
                              uVar23 = vcmpps_avx512vl(auVar114,auVar63,5);
                              bVar38 = bVar38 & (byte)uVar23;
                              if (bVar38 != 0) {
                                auVar62 = vandps_avx512vl(auVar61,auVar149._0_16_);
                                auVar65 = vsubps_avx(auVar62,auVar123);
                                uVar23 = vcmpps_avx512vl(auVar65,auVar114,5);
                                bVar38 = bVar38 & (byte)uVar23;
                                if (bVar38 != 0) {
                                  auVar82 = vmovdqa64_avx512vl(auVar154._0_16_);
                                  auVar64 = vmovdqa64_avx512vl(auVar105._0_16_);
                                  auVar124._0_4_ = auVar79._0_4_ * auVar71._0_4_;
                                  auVar124._4_4_ = auVar79._4_4_ * auVar71._4_4_;
                                  auVar124._8_4_ = auVar79._8_4_ * auVar71._8_4_;
                                  auVar124._12_4_ = auVar79._12_4_ * auVar71._12_4_;
                                  auVar66 = vfmadd213ps_fma(auVar70,auVar78,auVar124);
                                  auVar66 = vfmadd213ps_fma(auVar69,(undefined1  [16])aVar75,auVar66
                                                           );
                                  auVar103._0_4_ = auVar66._0_4_ ^ uVar98;
                                  auVar103._4_4_ = auVar66._4_4_ ^ uVar106;
                                  auVar103._8_4_ = auVar66._8_4_ ^ uVar107;
                                  auVar103._12_4_ = auVar66._12_4_ ^ uVar108;
                                  fVar85 = auVar62._0_4_;
                                  auVar125._0_4_ = fVar85 * *(float *)(ray + 0x30);
                                  fVar95 = auVar62._4_4_;
                                  auVar125._4_4_ = fVar95 * *(float *)(ray + 0x34);
                                  fVar96 = auVar62._8_4_;
                                  auVar125._8_4_ = fVar96 * *(float *)(ray + 0x38);
                                  fVar97 = auVar62._12_4_;
                                  auVar125._12_4_ = fVar97 * *(float *)(ray + 0x3c);
                                  auVar34 = *(undefined1 (*) [12])(ray + 0x80);
                                  fVar7 = *(float *)(ray + 0x8c);
                                  auVar135._0_4_ = *(float *)(ray + 0x80) * fVar85;
                                  auVar135._4_4_ = *(float *)(ray + 0x84) * fVar95;
                                  auVar135._8_4_ = *(float *)(ray + 0x88) * fVar96;
                                  auVar135._12_4_ = fVar7 * fVar97;
                                  uVar23 = vcmpps_avx512vl(auVar103,auVar135,2);
                                  uVar24 = vcmpps_avx512vl(auVar125,auVar103,1);
                                  bVar38 = bVar38 & (byte)uVar23 & (byte)uVar24;
                                  if (bVar38 != 0) {
                                    uVar23 = vcmpps_avx512vl(auVar61,ZEXT816(0) << 0x20,4);
                                    bVar38 = bVar38 & (byte)uVar23;
                                    if (bVar38 != 0) {
                                      pGVar14 = (context->scene->geometries).items
                                                [(uint)lower_z.field_0.i[uVar37]].ptr;
                                      uVar98 = pGVar14->mask;
                                      auVar119._4_4_ = uVar98;
                                      auVar119._0_4_ = uVar98;
                                      auVar119._8_4_ = uVar98;
                                      auVar119._12_4_ = uVar98;
                                      uVar23 = vptestmd_avx512vl(auVar119,*(undefined1 (*) [16])
                                                                           (ray + 0x90));
                                      bVar35 = (byte)uVar23 & 0xf & bVar38;
                                      if (bVar35 != 0) {
                                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                           (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                          auVar61 = vcvtsi2ss_avx512f(auVar74,*(ushort *)
                                                                               (lVar15 + 8 + lVar41)
                                                                              - 1);
                                          auVar66 = vcvtsi2ss_avx512f(auVar74,*(ushort *)
                                                                               (lVar15 + 10 + lVar41
                                                                               ) - 1);
                                          auVar67 = vcvtsi2ss_avx512f(auVar74,((uint)uVar37 & 1) +
                                                                              uVar55);
                                          auVar68 = vcvtsi2ss_avx512f(auVar74,((uint)(uVar37 >> 1) &
                                                                              0x7fffffff) + uVar51);
                                          vpbroadcastd_avx512vl();
                                          auVar28._12_4_ = 0;
                                          auVar28._0_12_ = ZEXT812(0);
                                          auVar69 = vrcp14ss_avx512f(auVar28 << 0x20,
                                                                     ZEXT416(auVar61._0_4_));
                                          auVar61 = vfnmadd213ss_fma(auVar61,auVar69,
                                                                     SUB6416(ZEXT464(0x40000000),0))
                                          ;
                                          fVar8 = auVar69._0_4_ * auVar61._0_4_;
                                          fVar133 = auVar67._0_4_;
                                          auVar136._0_4_ = fVar133 * fVar85 + auVar65._0_4_;
                                          auVar136._4_4_ = fVar133 * fVar95 + auVar65._4_4_;
                                          auVar136._8_4_ = fVar133 * fVar96 + auVar65._8_4_;
                                          auVar136._12_4_ = fVar133 * fVar97 + auVar65._12_4_;
                                          auVar120._4_4_ = fVar8;
                                          auVar120._0_4_ = fVar8;
                                          auVar120._8_4_ = fVar8;
                                          auVar120._12_4_ = fVar8;
                                          vmulps_avx512vl(auVar136,auVar120);
                                          auVar65 = vrcp14ss_avx512f(auVar28 << 0x20,
                                                                     ZEXT416(auVar66._0_4_));
                                          auVar61 = vfnmadd213ss_fma(auVar66,auVar65,
                                                                     SUB6416(ZEXT464(0x40000000),0))
                                          ;
                                          fVar8 = auVar65._0_4_ * auVar61._0_4_;
                                          auVar61 = vsubps_avx(auVar62,auVar114);
                                          fVar133 = auVar68._0_4_;
                                          auVar127._0_4_ = fVar133 * fVar85 + auVar61._0_4_;
                                          auVar127._4_4_ = fVar133 * fVar95 + auVar61._4_4_;
                                          auVar127._8_4_ = fVar133 * fVar96 + auVar61._8_4_;
                                          auVar127._12_4_ = fVar133 * fVar97 + auVar61._12_4_;
                                          auVar121._4_4_ = fVar8;
                                          auVar121._0_4_ = fVar8;
                                          auVar121._8_4_ = fVar8;
                                          auVar121._12_4_ = fVar8;
                                          auVar66 = vmulps_avx512vl(auVar127,auVar121);
                                          bVar58 = (bool)(bVar38 >> 1 & 1);
                                          bVar18 = (bool)(bVar38 >> 2 & 1);
                                          auVar65 = vrcp14ps_avx512vl(auVar62);
                                          auVar26._8_4_ = 0x3f800000;
                                          auVar26._0_8_ = 0x3f8000003f800000;
                                          auVar26._12_4_ = 0x3f800000;
                                          auVar62 = vfnmadd213ps_avx512vl(auVar62,auVar65,auVar26);
                                          auVar65 = vfmadd132ps_fma(auVar62,auVar65,auVar65);
                                          vpbroadcastd_avx512vl();
                                          upper_x.field_0 = aVar75;
                                          auVar94 = ZEXT1632(CONCAT412((float)((uint)(bVar38 >> 3) *
                                                                               auVar66._12_4_ |
                                                                              (uint)!(bool)(bVar38 
                                                  >> 3) * (int)auVar61._12_4_) * auVar65._12_4_,
                                                  CONCAT48((float)((uint)bVar18 * auVar66._8_4_ |
                                                                  (uint)!bVar18 * (int)auVar61._8_4_
                                                                  ) * auVar65._8_4_,
                                                           CONCAT44((float)((uint)bVar58 *
                                                                            auVar66._4_4_ |
                                                                           (uint)!bVar58 *
                                                                           (int)auVar61._4_4_) *
                                                                    auVar65._4_4_,
                                                                    (float)((uint)(bVar38 & 1) *
                                                                            auVar66._0_4_ |
                                                                           (uint)!(bool)(bVar38 & 1)
                                                                           * (int)auVar61._0_4_) *
                                                                    auVar65._0_4_))));
                                          vpcmpeqd_avx2(auVar94,auVar94);
                                          local_1af8._0_4_ = auVar34._0_4_;
                                          local_1af8._4_4_ = auVar34._4_4_;
                                          fStack_1af0 = auVar34._8_4_;
                                          auVar61 = vmulps_avx512vl(auVar65,auVar103);
                                          auVar84._0_4_ =
                                               (uint)(bVar35 & 1) * auVar61._0_4_ |
                                               (uint)!(bool)(bVar35 & 1) * local_1af8._0_4_;
                                          bVar58 = (bool)(bVar35 >> 1 & 1);
                                          auVar84._4_4_ =
                                               (uint)bVar58 * auVar61._4_4_ |
                                               (uint)!bVar58 * local_1af8._4_4_;
                                          bVar58 = (bool)(bVar35 >> 2 & 1);
                                          auVar84._8_4_ =
                                               (uint)bVar58 * auVar61._8_4_ |
                                               (uint)!bVar58 * (int)fStack_1af0;
                                          auVar84._12_4_ =
                                               (uint)(bVar35 >> 3) * auVar61._12_4_ |
                                               (uint)!(bool)(bVar35 >> 3) * (int)fVar7;
                                          *(undefined1 (*) [16])(ray + 0x80) = auVar84;
                                          upper_y.field_0 =
                                               (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                               vpmovm2d_avx512vl((ulong)bVar35);
                                          lower_y.field_0._8_8_ = pGVar14->userPtr;
                                          lower_y.field_0._0_8_ = &upper_y;
                                          if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                          {
                                            (*pGVar14->occlusionFilterN)
                                                      ((RTCFilterFunctionNArguments *)&lower_y);
                                          }
                                          uVar48 = vptestmd_avx512vl((undefined1  [16])
                                                                     upper_y.field_0,
                                                                     (undefined1  [16])
                                                                     upper_y.field_0);
                                          if ((uVar48 & 0xf) == 0) {
                                            uVar48 = 0;
                                          }
                                          else {
                                            p_Var17 = context->args->filter;
                                            if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                                               (((context->args->flags &
                                                 RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                                              (*p_Var17)((RTCFilterFunctionNArguments *)&lower_y);
                                            }
                                            uVar48 = vptestmd_avx512vl((undefined1  [16])
                                                                       upper_y.field_0,
                                                                       (undefined1  [16])
                                                                       upper_y.field_0);
                                            uVar48 = uVar48 & 0xf;
                                            auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                            bVar58 = (bool)((byte)uVar48 & 1);
                                            bVar18 = (bool)((byte)(uVar48 >> 1) & 1);
                                            bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
                                            bVar20 = SUB81(uVar48 >> 3,0);
                                            *(uint *)(ray + 0x80) =
                                                 (uint)bVar58 * auVar61._0_4_ |
                                                 (uint)!bVar58 * *(int *)(ray + 0x80);
                                            *(uint *)(ray + 0x84) =
                                                 (uint)bVar18 * auVar61._4_4_ |
                                                 (uint)!bVar18 * *(int *)(ray + 0x84);
                                            *(uint *)(ray + 0x88) =
                                                 (uint)bVar19 * auVar61._8_4_ |
                                                 (uint)!bVar19 * *(int *)(ray + 0x88);
                                            *(uint *)(ray + 0x8c) =
                                                 (uint)bVar20 * auVar61._12_4_ |
                                                 (uint)!bVar20 * *(int *)(ray + 0x8c);
                                          }
                                          bVar35 = (byte)uVar48;
                                          bVar58 = (bool)((byte)(uVar48 >> 1) & 1);
                                          bVar18 = (bool)((byte)(uVar48 >> 2) & 1);
                                          bVar19 = SUB81(uVar48 >> 3,0);
                                          *(uint *)pRVar1 =
                                               (uint)(bVar35 & 1) * *(int *)pRVar1 |
                                               (uint)!(bool)(bVar35 & 1) * local_1af8._0_4_;
                                          *(uint *)(ray + 0x84) =
                                               (uint)bVar58 * *(int *)(ray + 0x84) |
                                               (uint)!bVar58 * local_1af8._4_4_;
                                          *(uint *)(ray + 0x88) =
                                               (uint)bVar18 * *(int *)(ray + 0x88) |
                                               (uint)!bVar18 * (int)fStack_1af0;
                                          *(uint *)(ray + 0x8c) =
                                               (uint)bVar19 * *(int *)(ray + 0x8c) |
                                               (uint)!bVar19 * (int)fVar7;
                                        }
                                        uVar53 = (ushort)(byte)((bVar35 ^ 0xf) & (byte)uVar53);
                                      }
                                    }
                                  }
                                  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar149 = ZEXT1664(auVar61);
                                  auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  auVar150 = ZEXT1664(auVar61);
                                  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar151 = ZEXT1664(auVar61);
                                  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar152 = ZEXT1664(auVar61);
                                  auVar61 = vxorps_avx512vl(auVar63,auVar63);
                                  auVar153 = ZEXT1664(auVar61);
                                  auVar61 = vmovdqa64_avx512vl(auVar64);
                                  auVar105 = ZEXT1664(auVar61);
                                  auVar61 = vmovdqa64_avx512vl(auVar82);
                                  auVar154 = ZEXT1664(auVar61);
                                }
                              }
                            }
                            if ((byte)uVar53 == 0) break;
                            pfVar43 = pfVar43 + 0x10;
                            bVar58 = uVar37 < 3;
                            uVar37 = uVar37 + 1;
                          } while (bVar58);
                          bVar39 = bVar39 & (byte)uVar53;
                          uVar53 = (ushort)bVar39;
                          bVar58 = bVar39 == 0;
                        }
                      } while ((!bVar58) && (uVar46 = uVar46 - 1 & uVar46, uVar46 != 0));
                    }
                    lVar40 = lVar40 + 1;
                  } while (lVar40 != uVar60 - 8);
                  bVar39 = ~(byte)uVar53 & 0xf;
                }
                auVar61 = auVar150._0_16_;
                local_1b24 = local_1b24 | bVar39;
                uVar53 = (ushort)local_1b24;
                if (local_1b24 == 0xf) {
                  local_1b24 = 0xf;
                  goto LAB_006b3048;
                }
                auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar58 = (bool)(local_1b24 >> 1 & 1);
                bVar18 = (bool)(local_1b24 >> 2 & 1);
                bVar19 = (bool)(local_1b24 >> 3 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar58 * auVar61._4_4_ | (uint)!bVar58 * tray.tfar.field_0.i[1];
                tray.tfar.field_0.i[0] =
                     (uint)(local_1b24 & 1) * auVar61._0_4_ |
                     (uint)!(bool)(local_1b24 & 1) * tray.tfar.field_0.i[0];
                tray.tfar.field_0.i[2] =
                     (uint)bVar18 * auVar61._8_4_ | (uint)!bVar18 * tray.tfar.field_0.i[2];
                tray.tfar.field_0.i[3] =
                     (uint)bVar19 * auVar61._12_4_ | (uint)!bVar19 * tray.tfar.field_0.i[3];
              }
              goto LAB_006b1e26;
            }
            lVar40 = 0;
            auVar61 = auVar151._0_16_;
            do {
              sVar13 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar40 * 8);
              if (sVar13 == 8) {
                auVar105 = ZEXT1664(auVar61);
                break;
              }
              auVar69._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar69._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar69._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar69._12_4_ = tray.org_rdir.field_0._12_4_;
              uVar54 = *(undefined4 *)(root.ptr + 0x20 + lVar40 * 4);
              auVar71._4_4_ = uVar54;
              auVar71._0_4_ = uVar54;
              auVar71._8_4_ = uVar54;
              auVar71._12_4_ = uVar54;
              auVar63 = vfmsub132ps_fma(auVar71,auVar69,
                                        (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
              uVar54 = *(undefined4 *)(root.ptr + 0x40 + lVar40 * 4);
              auVar72._4_4_ = uVar54;
              auVar72._0_4_ = uVar54;
              auVar72._8_4_ = uVar54;
              auVar72._12_4_ = uVar54;
              auVar70._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar70._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar70._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar70._12_4_ = tray.org_rdir.field_0._44_4_;
              uVar54 = *(undefined4 *)(root.ptr + 0x60 + lVar40 * 4);
              auVar73._4_4_ = uVar54;
              auVar73._0_4_ = uVar54;
              auVar73._8_4_ = uVar54;
              auVar73._12_4_ = uVar54;
              auVar82 = vfmsub132ps_fma(auVar72,(undefined1  [16])
                                                tray.org_rdir.field_0.field_0.y.field_0,
                                        (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
              auVar64 = vfmsub132ps_fma(auVar73,auVar70,
                                        (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
              uVar54 = *(undefined4 *)(root.ptr + 0x30 + lVar40 * 4);
              auVar65._4_4_ = uVar54;
              auVar65._0_4_ = uVar54;
              auVar65._8_4_ = uVar54;
              auVar65._12_4_ = uVar54;
              auVar66 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar69,
                                   auVar65);
              uVar54 = *(undefined4 *)(root.ptr + 0x50 + lVar40 * 4);
              auVar67._4_4_ = uVar54;
              auVar67._0_4_ = uVar54;
              auVar67._8_4_ = uVar54;
              auVar67._12_4_ = uVar54;
              auVar67 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                   (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0,auVar67
                                  );
              uVar54 = *(undefined4 *)(root.ptr + 0x70 + lVar40 * 4);
              auVar68._4_4_ = uVar54;
              auVar68._0_4_ = uVar54;
              auVar68._8_4_ = uVar54;
              auVar68._12_4_ = uVar54;
              auVar68 = vfmsub132ps_avx512vl
                                  ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar70,
                                   auVar68);
              auVar65 = vpminsd_avx(auVar63,auVar66);
              auVar62 = vpminsd_avx(auVar82,auVar67);
              auVar65 = vpmaxsd_avx(auVar65,auVar62);
              auVar62 = vpminsd_avx(auVar64,auVar68);
              auVar65 = vpmaxsd_avx(auVar65,auVar62);
              auVar62 = vpmaxsd_avx(auVar63,auVar66);
              auVar63 = vpmaxsd_avx(auVar82,auVar67);
              auVar63 = vpminsd_avx(auVar62,auVar63);
              auVar62 = vpmaxsd_avx(auVar64,auVar68);
              auVar63 = vpminsd_avx(auVar63,auVar62);
              auVar62 = vpmaxsd_avx(auVar65,(undefined1  [16])tray.tnear.field_0);
              auVar63 = vpminsd_avx(auVar63,(undefined1  [16])tray.tfar.field_0);
              uVar60 = vpcmpd_avx512vl(auVar62,auVar63,2);
              uVar60 = uVar60 & 0xf;
              if ((byte)uVar60 == 0) {
                auVar105 = ZEXT1664(auVar61);
                sVar13 = sVar45;
              }
              else {
                auVar62 = vblendmps_avx512vl(auVar151._0_16_,auVar65);
                bVar58 = (bool)((byte)uVar60 & 1);
                bVar18 = (bool)((byte)(uVar60 >> 1) & 1);
                bVar19 = (bool)((byte)(uVar60 >> 2) & 1);
                bVar20 = SUB81(uVar60 >> 3,0);
                auVar105 = ZEXT1664(CONCAT412((uint)bVar20 * auVar62._12_4_ |
                                              (uint)!bVar20 * auVar65._12_4_,
                                              CONCAT48((uint)bVar19 * auVar62._8_4_ |
                                                       (uint)!bVar19 * auVar65._8_4_,
                                                       CONCAT44((uint)bVar18 * auVar62._4_4_ |
                                                                (uint)!bVar18 * auVar65._4_4_,
                                                                (uint)bVar58 * auVar62._0_4_ |
                                                                (uint)!bVar58 * auVar65._0_4_))));
                if (sVar45 != 8) {
                  pNVar44->ptr = sVar45;
                  pNVar44 = pNVar44 + 1;
                  *(undefined1 (*) [16])paVar57->v = auVar61;
                  paVar57 = paVar57 + 1;
                }
              }
              sVar45 = sVar13;
              lVar40 = lVar40 + 1;
              auVar61 = auVar105._0_16_;
            } while (lVar40 != 4);
            if (sVar45 == 8) goto LAB_006b1fd4;
            uVar23 = vcmpps_avx512vl((undefined1  [16])auVar105._0_16_,
                                     (undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar45;
          } while ((byte)uVar47 < (byte)POPCOUNT((int)uVar23));
          pNVar44->ptr = sVar45;
          pNVar44 = pNVar44 + 1;
          *paVar57 = auVar105._0_16_;
          paVar57 = paVar57 + 1;
LAB_006b1fd4:
          iVar36 = 4;
        }
        else {
          do {
            sVar45 = 0;
            for (uVar52 = uVar60; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
              sVar45 = sVar45 + 1;
            }
            bVar58 = occluded1(This,bvh,root,sVar45,&pre,ray,&tray,context);
            bVar39 = (byte)(1 << ((uint)sVar45 & 0x1f));
            if (!bVar58) {
              bVar39 = 0;
            }
            bVar39 = (byte)uVar53 | bVar39;
            uVar53 = (ushort)bVar39;
            uVar60 = uVar60 - 1 & uVar60;
          } while (uVar60 != 0);
          iVar36 = 3;
          if (bVar39 != 0xf) {
            auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar58 = (bool)(bVar39 >> 1 & 1);
            bVar18 = (bool)(bVar39 >> 2 & 1);
            bVar19 = (bool)(bVar39 >> 3 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar58 * auVar61._4_4_ | (uint)!bVar58 * tray.tfar.field_0.i[1];
            tray.tfar.field_0.i[0] =
                 (uint)(bVar39 & 1) * auVar61._0_4_ |
                 (uint)!(bool)(bVar39 & 1) * tray.tfar.field_0.i[0];
            tray.tfar.field_0.i[2] =
                 (uint)bVar18 * auVar61._8_4_ | (uint)!bVar18 * tray.tfar.field_0.i[2];
            tray.tfar.field_0.i[3] =
                 (uint)bVar19 * auVar61._12_4_ | (uint)!bVar19 * tray.tfar.field_0.i[3];
            iVar36 = 2;
          }
          auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar149 = ZEXT1664(auVar61);
          auVar61 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar150 = ZEXT1664(auVar61);
          auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar151 = ZEXT1664(auVar61);
          auVar61 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar152 = ZEXT1664(auVar61);
          auVar61 = vxorps_avx512vl(auVar153._0_16_,auVar153._0_16_);
          auVar153 = ZEXT1664(auVar61);
          auVar105 = ZEXT1664((undefined1  [16])vVar10.field_0);
          if (uVar47 < (uint)POPCOUNT(uVar54)) goto LAB_006b1e6e;
        }
        local_1b24 = (byte)uVar53;
        auVar61 = auVar150._0_16_;
        if (iVar36 == 3) {
LAB_006b3048:
          local_1b24 = local_1b24 & bVar59;
          bVar58 = (bool)(local_1b24 >> 1 & 1);
          bVar18 = (bool)(local_1b24 >> 2 & 1);
          *(uint *)pRVar1 =
               (uint)(local_1b24 & 1) * auVar61._0_4_ |
               (uint)!(bool)(local_1b24 & 1) * *(int *)pRVar1;
          *(uint *)(ray + 0x84) =
               (uint)bVar58 * auVar61._4_4_ | (uint)!bVar58 * *(int *)(ray + 0x84);
          *(uint *)(ray + 0x88) =
               (uint)bVar18 * auVar61._8_4_ | (uint)!bVar18 * *(int *)(ray + 0x88);
          *(uint *)(ray + 0x8c) =
               (uint)(local_1b24 >> 3) * auVar61._12_4_ |
               (uint)!(bool)(local_1b24 >> 3) * *(int *)(ray + 0x8c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }